

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::semicolon(Forth *this)

{
  Cell *pCVar1;
  pointer pDVar2;
  
  data(this,3);
  data(this,4);
  setIsCompiling(this,this->False);
  pDVar2 = (this->definitions).
           super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar1 = &pDVar2[-1].flags;
  *pCVar1 = *pCVar1 ^ pDVar2[-1].FlagHidden;
  std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
  clear(&this->localVariables);
  return;
}

Assistant:

void semicolon() {
			data(CELL(exitXt));
			data(CELL(endOfDefinitionXt));
			setIsCompiling( False );
			lastDefinition().toggleHidden(); // @bug lastDefinition can be not last if compilation created additional definitions
			/// 13.3.3.1 These temporary dictionary entries shall vanish at the end of the definition, 
			/// denoted by ; (semicolon), ;CODE, or DOES>. 
			localVariables.clear();
		}